

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<float,_void>::load
          (type_caster<float,_void> *this,handle src,bool convert)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  PyObject **ppPVar4;
  long lVar5;
  _object *ptr;
  byte in_DL;
  PyObject *in_RDI;
  double dVar6;
  object tmp;
  bool py_err;
  anon_class_1_0_00000001 index_check;
  py_type py_value;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  handle in_stack_ffffffffffffffa8;
  handle local_40 [2];
  byte local_2a;
  undefined1 convert_00;
  undefined7 in_stack_ffffffffffffffe0;
  handle src_00;
  handle local_10;
  byte local_1;
  
  bVar1 = in_DL & 1;
  src_00.m_ptr = in_RDI;
  bVar2 = pybind11::handle::operator_cast_to_bool(&local_10);
  if (bVar2) {
    if ((bVar1 & 1) == 0) {
      pybind11::handle::ptr(&local_10);
      iVar3 = _PyObject_TypeCheck(in_RDI,(PyTypeObject *)
                                         CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           in_stack_ffffffffffffff98)));
      if (iVar3 == 0) {
        local_1 = 0;
        goto LAB_002ce45d;
      }
    }
    ppPVar4 = pybind11::handle::ptr(&local_10);
    dVar6 = (double)PyFloat_AsDouble(*ppPVar4);
    local_2a = false;
    if ((dVar6 == -1.0) && (!NAN(dVar6))) {
      lVar5 = PyErr_Occurred();
      local_2a = lVar5 != 0;
    }
    if ((bool)local_2a == false) {
      *(float *)&in_RDI->ob_refcnt = (float)dVar6;
      local_1 = 1;
    }
    else {
      PyErr_Clear();
      convert_00 = (undefined1)((ulong)dVar6 >> 0x38);
      if (((local_2a & 1) != 0) && ((bVar1 & 1) != 0)) {
        ppPVar4 = pybind11::handle::ptr(&local_10);
        iVar3 = PyNumber_Check(*ppPVar4);
        if (iVar3 != 0) {
          ppPVar4 = pybind11::handle::ptr(&local_10);
          ptr = (_object *)PyNumber_Float(*ppPVar4);
          pybind11::handle::handle<_object_*,_0>(local_40,ptr);
          reinterpret_steal<pybind11::object>(in_stack_ffffffffffffffa8);
          PyErr_Clear();
          local_1 = load((type_caster<float,_void> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                         src_00,(bool)convert_00);
          object::~object((object *)0x2ce422);
          goto LAB_002ce45d;
        }
      }
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_002ce45d:
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        py_type py_value;

        if (!src) {
            return false;
        }

#if !defined(PYPY_VERSION)
        auto index_check = [](PyObject *o) { return PyIndex_Check(o); };
#else
        // In PyPy 7.3.3, `PyIndex_Check` is implemented by calling `__index__`,
        // while CPython only considers the existence of `nb_index`/`__index__`.
        auto index_check = [](PyObject *o) { return hasattr(o, "__index__"); };
#endif

        if (std::is_floating_point<T>::value) {
            if (convert || PyFloat_Check(src.ptr())) {
                py_value = (py_type) PyFloat_AsDouble(src.ptr());
            } else {
                return false;
            }
        } else if (PyFloat_Check(src.ptr())
                   || (!convert && !PYBIND11_LONG_CHECK(src.ptr()) && !index_check(src.ptr()))) {
            return false;
        } else {
            handle src_or_index = src;
            // PyPy: 7.3.7's 3.8 does not implement PyLong_*'s __index__ calls.
#if PY_VERSION_HEX < 0x03080000 || defined(PYPY_VERSION)
            object index;
            if (!PYBIND11_LONG_CHECK(src.ptr())) { // So: index_check(src.ptr())
                index = reinterpret_steal<object>(PyNumber_Index(src.ptr()));
                if (!index) {
                    PyErr_Clear();
                    if (!convert)
                        return false;
                } else {
                    src_or_index = index;
                }
            }
#endif
            if (std::is_unsigned<py_type>::value) {
                py_value = as_unsigned<py_type>(src_or_index.ptr());
            } else { // signed integer:
                py_value = sizeof(T) <= sizeof(long)
                               ? (py_type) PyLong_AsLong(src_or_index.ptr())
                               : (py_type) PYBIND11_LONG_AS_LONGLONG(src_or_index.ptr());
            }
        }

        // Python API reported an error
        bool py_err = py_value == (py_type) -1 && PyErr_Occurred();

        // Check to see if the conversion is valid (integers should match exactly)
        // Signed/unsigned checks happen elsewhere
        if (py_err
            || (std::is_integral<T>::value && sizeof(py_type) != sizeof(T)
                && py_value != (py_type) (T) py_value)) {
            PyErr_Clear();
            if (py_err && convert && (PyNumber_Check(src.ptr()) != 0)) {
                auto tmp = reinterpret_steal<object>(std::is_floating_point<T>::value
                                                         ? PyNumber_Float(src.ptr())
                                                         : PyNumber_Long(src.ptr()));
                PyErr_Clear();
                return load(tmp, false);
            }
            return false;
        }

        value = (T) py_value;
        return true;
    }